

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chillout.cpp
# Opt level: O2

void __thiscall Debug::Chillout::setCrashCallback(Chillout *this,function<void_()> *callback)

{
  PosixCrashHandler *this_00;
  
  this_00 = PosixCrashHandler::getInstance();
  PosixCrashHandler::setCrashCallback(this_00,callback);
  return;
}

Assistant:

void Chillout::setCrashCallback(const std::function<void()> &callback) {
#ifdef _WIN32
        WindowsCrashHandler &handler = WindowsCrashHandler::getInstance();
#else
        PosixCrashHandler &handler = PosixCrashHandler::getInstance();
#endif
        handler.setCrashCallback(callback);
    }